

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

bool __thiscall glslang::TQualifier::isUniformOrBuffer(TQualifier *this)

{
  uint uVar1;
  TQualifier *this_local;
  
  uVar1 = *(uint *)&this->field_0x8 & 0x7f;
  this_local._7_1_ = uVar1 == 5 || uVar1 == 6;
  return this_local._7_1_;
}

Assistant:

bool isUniformOrBuffer() const
    {
        switch (storage) {
        case EvqUniform:
        case EvqBuffer:
            return true;
        default:
            return false;
        }
    }